

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::SubSurfaceMaterial::readFrom(SubSurfaceMaterial *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryReader *in_RSI;
  float *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(in_RSI,in_RDI);
  BinaryReader::read<float,void>(in_RSI,in_RDI);
  BinaryReader::read<bool,void>(in_RSI,(bool *)in_RDI);
  BinaryReader::read(in_RSI,(int)in_RDI + 0x48,__buf,in_RCX);
  return;
}

Assistant:

void SubSurfaceMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(name);
  }